

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCC.h
# Opt level: O2

void __thiscall dg::SCC<dg::pta::PSNode>::_compute(SCC<dg::pta::PSNode> *this,PSNode *n)

{
  CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *this_00;
  pointer ppPVar1;
  pointer pvVar2;
  pointer pvVar3;
  uint uVar4;
  NodeInfo *pNVar5;
  NodeInfo *pNVar6;
  uint uVar7;
  pointer ppPVar8;
  _Elt_pointer ppPVar9;
  PSNode *w;
  vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
  *local_60;
  PSNode *succ;
  pointer ppPStack_50;
  pointer local_48;
  PSNode *n_local;
  
  this_00 = &this->_info;
  n_local = n;
  pNVar5 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                     (this_00,&n_local);
  uVar4 = this->index + 1;
  this->index = uVar4;
  pNVar5->lowpt = uVar4;
  pNVar5->dfs_id = uVar4;
  pNVar5->on_stack = true;
  std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
            ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)this,&n_local);
  ppPVar1 = (n_local->super_SubgraphNode<dg::pta::PSNode>)._successors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar8 = (n_local->super_SubgraphNode<dg::pta::PSNode>)._successors.
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar8 != ppPVar1; ppPVar8 = ppPVar8 + 1) {
    succ = *ppPVar8;
    pNVar6 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                       (this_00,&succ);
    uVar4 = pNVar6->dfs_id;
    if (uVar4 == 0) {
      _compute(this,succ);
      uVar4 = pNVar6->lowpt;
LAB_0011713f:
      uVar7 = pNVar5->lowpt;
      if (uVar4 < pNVar5->lowpt) {
        uVar7 = uVar4;
      }
      pNVar5->lowpt = uVar7;
    }
    else if (pNVar6->on_stack == true) goto LAB_0011713f;
  }
  if (pNVar5->lowpt == pNVar5->dfs_id) {
    succ = (PSNode *)0x0;
    ppPStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    local_60 = (vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
                *)&this->scc;
    pvVar2 = (this->scc).
             super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (this->scc).
             super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppPVar9 = (this->stack).Container.c.
              super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    do {
      if (ppPVar9 ==
          *(_Elt_pointer *)
           ((long)&(this->stack).Container.c.
                   super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                   super__Deque_impl_data._M_finish + 8)) {
        ppPVar9 = (*(_Map_pointer *)
                    ((long)&(this->stack).Container.c.
                            super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
      }
      pNVar6 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                         (this_00,ppPVar9 + -1);
      if (pNVar6->dfs_id < pNVar5->dfs_id) break;
      w = ADT::QueueLIFO<dg::pta::PSNode_*>::pop(&this->stack);
      pNVar6 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                         (this_00,&w);
      pNVar6->on_stack = false;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&succ,&w);
      (w->super_SubgraphNode<dg::pta::PSNode>).scc_id = (uint)(((long)pvVar2 - (long)pvVar3) / 0x18)
      ;
      ppPVar9 = (this->stack).Container.c.
                super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
    } while (ppPVar9 !=
             (this->stack).Container.c.
             super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
    std::
    vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
    ::emplace_back<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
              (local_60,(vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&succ);
    std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
              ((_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&succ);
  }
  return;
}

Assistant:

void _compute(NodeT *n) {
        auto &info = _info[n];
        // here we using the fact that we are a friend class
        // of SubgraphNode. If we would need to make this
        // algorithm more generinc, we add setters/getters.
        info.dfs_id = info.lowpt = ++index;
        info.on_stack = true;
        stack.push(n);

        for (auto *succ : n->successors()) {
            auto &succ_info = _info[succ];
            if (succ_info.dfs_id == 0) {
                assert(!succ_info.on_stack);
                _compute(succ);
                info.lowpt = std::min(info.lowpt, succ_info.lowpt);
            } else if (succ_info.on_stack) {
                info.lowpt = std::min(info.lowpt, succ_info.dfs_id);
            }
        }

        if (info.lowpt == info.dfs_id) {
            SCC_component_t component;
            size_t component_num = scc.size();

            NodeT *w;
            while (_info[stack.top()].dfs_id >= info.dfs_id) {
                w = stack.pop();
                auto &winfo = _info[w];
                assert(winfo.on_stack == true);
                winfo.on_stack = false;
                component.push_back(w);
                // the numbers scc_id give
                // a reverse topological order
                w->setSCCId(component_num);

                if (stack.empty())
                    break;
            }

            scc.push_back(std::move(component));
        }
    }